

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void __thiscall amrex::ParmParse::add(ParmParse *this,char *name,IntVect *val)

{
  PP_entry entry;
  stringstream val_1;
  allocator local_249;
  string local_248;
  string local_228;
  string local_208;
  PP_entry local_1e8;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [46];
  
  std::__cxx11::string::string((string *)&local_208,name,&local_249);
  prefixedName(&local_248,this,&local_208);
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x11;
  amrex::operator<<((ostream *)&local_190,val);
  std::__cxx11::stringbuf::str();
  PP_entry::PP_entry(&local_1e8,&local_248,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  local_1e8.m_queried = true;
  std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
  push_back((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
            &(anonymous_namespace)::g_table_abi_cxx11_,&local_1e8);
  PP_entry::~PP_entry(&local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_208);
  return;
}

Assistant:

void
ParmParse::add (const char* name,
                const IntVect&  val)
{
    saddval(prefixedName(name),val);
}